

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR CorUnix::CPalSynchronizationManager::ThreadNativeWait
                    (ThreadNativeWaitData *ptnwdNativeWaitData,DWORD dwTimeout,
                    ThreadWakeupReason *ptwrWakeupReason,DWORD *pdwSignaledObject)

{
  int iVar1;
  int *piVar2;
  undefined1 local_48 [8];
  timespec tsAbsTmo;
  int iWaitRet;
  int iRet;
  PAL_ERROR palErr;
  DWORD *pdwSignaledObject_local;
  ThreadWakeupReason *ptwrWakeupReason_local;
  DWORD dwTimeout_local;
  ThreadNativeWaitData *ptnwdNativeWaitData_local;
  
  iWaitRet = 0;
  tsAbsTmo.tv_nsec._4_4_ = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if ((dwTimeout == 0xffffffff) ||
     (iWaitRet = GetAbsoluteTimeout(dwTimeout,(timespec *)local_48), iWaitRet == 0)) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)ptnwdNativeWaitData);
    if (iVar1 == 0) {
      do {
        if (ptnwdNativeWaitData->iPred != 0) goto LAB_0024a6e4;
        if (dwTimeout == 0xffffffff) {
          tsAbsTmo.tv_nsec._4_4_ =
               pthread_cond_wait((pthread_cond_t *)&ptnwdNativeWaitData->cond,
                                 (pthread_mutex_t *)ptnwdNativeWaitData);
        }
        else {
          tsAbsTmo.tv_nsec._4_4_ =
               pthread_cond_timedwait
                         ((pthread_cond_t *)&ptnwdNativeWaitData->cond,
                          (pthread_mutex_t *)ptnwdNativeWaitData,(timespec *)local_48);
        }
        if (tsAbsTmo.tv_nsec._4_4_ == 0x6e) {
          if (dwTimeout == 0xffffffff) {
            fprintf(_stderr,"] %s %s:%d","ThreadNativeWait",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                    ,0x1d2);
            fprintf(_stderr,
                    "Expression: INFINITE != dwTimeout, Description: Got a ETIMEDOUT despite timeout was INFINITE\n"
                   );
          }
          goto LAB_0024a6e4;
        }
      } while (tsAbsTmo.tv_nsec._4_4_ == 0);
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar2 = __errno_location();
      strerror(*piVar2);
      iWaitRet = 0x54f;
LAB_0024a6e4:
      if (tsAbsTmo.tv_nsec._4_4_ == 0) {
        ptnwdNativeWaitData->iPred = 0;
      }
      iVar1 = pthread_mutex_unlock((pthread_mutex_t *)ptnwdNativeWaitData);
      if (iVar1 == 0) {
        if (tsAbsTmo.tv_nsec._4_4_ == 0) {
          *ptwrWakeupReason = ptnwdNativeWaitData->twrWakeupReason;
          *pdwSignaledObject = ptnwdNativeWaitData->dwObjectIndex;
        }
        else if (tsAbsTmo.tv_nsec._4_4_ == 0x6e) {
          *ptwrWakeupReason = WaitTimeout;
        }
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        iWaitRet = 0x54f;
      }
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      iWaitRet = 0x54f;
      *ptwrWakeupReason = WaitFailed;
    }
  }
  else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return iWaitRet;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::ThreadNativeWait(
        ThreadNativeWaitData * ptnwdNativeWaitData,
        DWORD dwTimeout,
        ThreadWakeupReason * ptwrWakeupReason,
        DWORD * pdwSignaledObject)
    {
        PAL_ERROR palErr = NO_ERROR;
        int iRet, iWaitRet = 0;
        struct timespec tsAbsTmo;

        TRACE("ThreadNativeWait(ptnwdNativeWaitData=%p, dwTimeout=%u, ...)\n",
              ptnwdNativeWaitData, dwTimeout);

        if (dwTimeout != INFINITE)
        {
            // Calculate absolute timeout
            palErr = GetAbsoluteTimeout(dwTimeout, &tsAbsTmo);
            if (NO_ERROR != palErr)
            {
                ERROR("Failed to convert timeout to absolute timeout\n");
                goto TNW_exit;
            }
        }

        // Lock the mutex
        iRet = pthread_mutex_lock(&ptnwdNativeWaitData->mutex);
        if (0 != iRet)
        {
            ERROR("Internal Error: cannot lock mutex\n");
            palErr = ERROR_INTERNAL_ERROR;
            *ptwrWakeupReason = WaitFailed;
            goto TNW_exit;
        }

        while (FALSE == ptnwdNativeWaitData->iPred)
        {
            if (INFINITE == dwTimeout)
            {
                iWaitRet = pthread_cond_wait(&ptnwdNativeWaitData->cond,
                                             &ptnwdNativeWaitData->mutex);
            }
            else
            {
                iWaitRet = pthread_cond_timedwait(&ptnwdNativeWaitData->cond,
                                                  &ptnwdNativeWaitData->mutex,
                                                  &tsAbsTmo);
            }

            if (ETIMEDOUT == iWaitRet)
            {
                _ASSERT_MSG(INFINITE != dwTimeout,
                            "Got a ETIMEDOUT despite timeout was INFINITE\n");
                break;
            }
            else if (0 != iWaitRet)
            {
                ERROR("pthread_cond_%swait returned %d [errno=%d (%s)]\n",
                       (INFINITE == dwTimeout) ? "" : "timed",
                       iWaitRet, errno, strerror(errno));
                palErr = ERROR_INTERNAL_ERROR;
                break;
            }
        }

        // Reset the predicate
        if (0 == iWaitRet)
        {
            // We don't want to reset the predicate if pthread_cond_timedwait
            // timed out racing with a pthread_cond_signal. When
            // pthread_cond_timedwait times out, it needs to grab the mutex
            // before returning. At timeout time, it may happen that the
            // signaling thread just grabbed the mutex, but it hasn't called
            // pthread_cond_signal yet. In this scenario pthread_cond_timedwait
            // will have to wait for the signaling side to release the mutex.
            // As result it will return with error timeout, but the predicate
            // will be set. Since pthread_cond_timedwait timed out, the
            // predicate value is intended for the next signal. In case of a
            // object signaling racing with a wait timeout this predicate value
            // will be picked up by the 'second native wait' (see comments in
            // BlockThread).

            ptnwdNativeWaitData->iPred = FALSE;
        }

        // Unlock the mutex
        iRet = pthread_mutex_unlock(&ptnwdNativeWaitData->mutex);
        if (0 != iRet)
        {
            ERROR("Cannot unlock mutex [err=%d]\n", iRet);
            palErr = ERROR_INTERNAL_ERROR;
            goto TNW_exit;
        }

        _ASSERT_MSG(ETIMEDOUT != iRet || INFINITE != dwTimeout,
                    "Got time out return code with INFINITE timeout\n");

        if (0 == iWaitRet)
        {
            *ptwrWakeupReason  = ptnwdNativeWaitData->twrWakeupReason;
            *pdwSignaledObject = ptnwdNativeWaitData->dwObjectIndex;
        }
        else if (ETIMEDOUT == iWaitRet)
        {
            *ptwrWakeupReason = WaitTimeout;
        }

    TNW_exit:

        TRACE("ThreadNativeWait: returning %u [WakeupReason=%u]\n",
              palErr, *ptwrWakeupReason);

        return palErr;
    }